

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

EmulatorEvent emulator_run_until(Emulator *e,Ticks until_ticks)

{
  u32 uVar1;
  u32 uVar2;
  AudioBuffer *audio_buffer;
  ulong uVar3;
  bool bVar4;
  ulong local_50;
  Ticks check_ticks;
  Ticks max_audio_ticks;
  u64 frames_left;
  AudioBuffer *ab;
  Ticks until_ticks_local;
  Emulator *e_local;
  
  audio_buffer = &e->audio_buffer;
  if (((e->state).event & 2) != 0) {
    (e->audio_buffer).position = (e->audio_buffer).data;
  }
  check_joyp_intr(e);
  (e->state).event = 0;
  uVar1 = (e->audio_buffer).frames;
  uVar2 = audio_buffer_get_frames(audio_buffer);
  uVar3 = (e->state).apu.sync_ticks +
          ((((ulong)(uVar1 - uVar2) * 0x400000 + (ulong)audio_buffer->frequency) - 1) /
           (ulong)audio_buffer->frequency & 0xffffffff);
  local_50 = uVar3;
  if (until_ticks < uVar3) {
    local_50 = until_ticks;
  }
  while( true ) {
    bVar4 = false;
    if ((e->state).event == 0) {
      bVar4 = (e->state).ticks < local_50;
    }
    if (!bVar4) break;
    emulator_step_internal(e);
  }
  if (uVar3 <= (e->state).ticks) {
    (e->state).event = (e->state).event | 2;
  }
  if (until_ticks <= (e->state).ticks) {
    (e->state).event = (e->state).event | 4;
  }
  apu_synchronize(e);
  return (e->state).event;
}

Assistant:

EmulatorEvent emulator_run_until(Emulator* e, Ticks until_ticks) {
  AudioBuffer* ab = &e->audio_buffer;
  if (e->state.event & EMULATOR_EVENT_AUDIO_BUFFER_FULL) {
    ab->position = ab->data;
  }
  check_joyp_intr(e);
  e->state.event = 0;

  u64 frames_left = ab->frames - audio_buffer_get_frames(ab);
  Ticks max_audio_ticks =
      APU.sync_ticks +
      (u32)DIV_CEIL(frames_left * CPU_TICKS_PER_SECOND, ab->frequency);
  Ticks check_ticks = MIN(until_ticks, max_audio_ticks);
  while (e->state.event == 0 && TICKS < check_ticks) {
    emulator_step_internal(e);
  }
  if (TICKS >= max_audio_ticks) {
    e->state.event |= EMULATOR_EVENT_AUDIO_BUFFER_FULL;
  }
  if (TICKS >= until_ticks) {
    e->state.event |= EMULATOR_EVENT_UNTIL_TICKS;
  }
  apu_synchronize(e);
  return e->state.event;
}